

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

CBNode * __thiscall asmjit::CodeBuilder::addAfter(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  CBNode *pCVar1;
  CBNode *pCVar2;
  
  if (node == (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x139,"node");
  }
  if (ref == (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x13a,"ref");
  }
  if (node->_prev != (CBNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
               ,0x13c,"node->_prev == nullptr");
  }
  if (node->_next == (CBNode *)0x0) {
    pCVar1 = ref->_next;
    node->_prev = ref;
    node->_next = pCVar1;
    ref->_next = node;
    pCVar2 = (CBNode *)&this->_lastNode;
    if (pCVar1 != (CBNode *)0x0) {
      pCVar2 = pCVar1;
    }
    pCVar2->_prev = node;
    return node;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/codebuilder.cpp"
             ,0x13d,"node->_next == nullptr");
}

Assistant:

CBNode* CodeBuilder::addAfter(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(ref);

  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  CBNode* prev = ref;
  CBNode* next = ref->_next;

  node->_prev = prev;
  node->_next = next;

  prev->_next = node;
  if (next)
    next->_prev = node;
  else
    _lastNode = node;

  return node;
}